

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

int __thiscall vm_rcdesc::init(vm_rcdesc *this,EVP_PKEY_CTX *ctx)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  uchar *puVar2;
  unsigned_short in_CX;
  undefined8 *in_RDX;
  vm_val_t *in_R8;
  int in_R9D;
  
  this->name = (char *)ctx;
  (this->bifptr).typ = VM_NIL;
  aVar1 = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1);
  *(undefined8 *)&this->self = *in_RDX;
  (this->self).val = aVar1;
  this->method_idx = in_CX;
  this->argp = in_R8;
  this->argc = in_R9D;
  if (pc_ptr_ == (uchar **)0x0) {
    puVar2 = (uchar *)0x0;
  }
  else {
    puVar2 = *pc_ptr_;
  }
  this->caller_addr = puVar2;
  return (int)puVar2;
}

Assistant:

void vm_rcdesc::init(VMG_ const char *name,
                     const vm_val_t *self, unsigned short method_idx,
                     vm_val_t *argp, int argc)
{
    this->name = name;
    this->bifptr.set_nil();
    this->self = *self;
    this->method_idx = method_idx;
    this->argp = argp;
    this->argc = argc;
    this->caller_addr = G_interpreter->get_last_pc();
}